

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,char *c)

{
  QTextStreamPrivate *pQVar1;
  bool bVar2;
  char *pcVar3;
  State *state;
  long in_FS_OFFSET;
  QStringView in;
  qsizetype length;
  QChar *ptr;
  undefined1 local_60 [8];
  State SStack_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  *c = '\0';
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    local_60._0_4_ = 2;
    SStack_58.remainingChars._4_4_ = 0;
    local_60._4_4_ = 0;
    SStack_58.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x0;
    SStack_58.internalState = 0;
    SStack_58.remainingChars._0_4_ = 0;
    SStack_58.invalidChars = 0x455595;
    QMessageLogger::warning((QMessageLogger *)local_60,"QTextStream: No device");
  }
  else {
    QTextStreamPrivate::scan(pQVar1,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
    QTextStreamPrivate::consumeLastToken(pQVar1);
    ptr = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
    length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    state = (State *)0x0;
    bVar2 = QTextStreamPrivate::scan(pQVar1,&ptr,&length,0,Space);
    if (bVar2) {
      local_60._0_4_ = 0x666a00;
      local_60._4_4_ = 0;
      SStack_58.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
           (QFlagsStorage<QStringConverterBase::Flag>)0x0;
      SStack_58.internalState = 0;
      SStack_58.remainingChars._0_4_ = 0;
      SStack_58.remainingChars._4_4_ = 0;
      SStack_58.invalidChars = 0;
      SStack_58.field_4.d[0] = (void *)0x0;
      SStack_58.field_4.d[1] = (void *)0x0;
      SStack_58.clearFn = (ClearDataFn)0x0;
      in.m_data = (storage_type_conflict *)&SStack_58;
      in.m_size = (qsizetype)ptr;
      pcVar3 = QUtf8::convertFromUnicode((QUtf8 *)c,(char *)length,in,state);
      *pcVar3 = '\0';
      QTextStreamPrivate::consumeLastToken(pQVar1);
      QStringConverterBase::State::clear(&SStack_58);
    }
    else {
      pQVar1 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
      if (pQVar1->status == Ok) {
        pQVar1->status = ReadPastEnd;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(char *c)
{
    Q_D(QTextStream);
    *c = 0;
    CHECK_VALID_STREAM(*this);
    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    d->consumeLastToken();

    const QChar *ptr;
    qsizetype length;
    if (!d->scan(&ptr, &length, 0, QTextStreamPrivate::Space)) {
        setStatus(ReadPastEnd);
        return *this;
    }

    QStringEncoder encoder(QStringConverter::Utf8);
    char *e = encoder.appendToBuffer(c, QStringView(ptr, length));
    *e = '\0';
    d->consumeLastToken();
    return *this;
}